

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_str_append_str_runes(nk_str *str,nk_rune *runes)

{
  int len;
  long lVar1;
  nk_rune u;
  nk_glyph glyph;
  char local_24 [4];
  
  if (str != (nk_str *)0x0) {
    lVar1 = 0;
    if ((runes != (nk_rune *)0x0) && (u = *runes, u != 0)) {
      lVar1 = 0;
      do {
        len = nk_utf_encode(u,local_24,4);
        nk_str_append_text_char(str,local_24,len);
        u = runes[lVar1 + 1];
        lVar1 = lVar1 + 1;
      } while (u != 0);
    }
    return (int)lVar1;
  }
  __assert_fail("str",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                ,0x2066,"int nk_str_append_str_runes(struct nk_str *, const nk_rune *)");
}

Assistant:

NK_API int
nk_str_append_str_runes(struct nk_str *str, const nk_rune *runes)
{
    int i = 0;
    nk_glyph glyph;
    int byte_len;
    NK_ASSERT(str);
    if (!str || !runes) return 0;
    while (runes[i] != '\0') {
        byte_len = nk_utf_encode(runes[i], glyph, NK_UTF_SIZE);
        nk_str_append_text_char(str, glyph, byte_len);
        i++;
    }
    return i;
}